

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void el::base::utils::File::buildStrippedFilename(char *filename,char *buff,size_t limit)

{
  size_t sVar1;
  size_t sizeOfFilename;
  size_t limit_local;
  char *buff_local;
  char *filename_local;
  
  sVar1 = strlen(filename);
  buff_local = filename;
  if (((limit <= sVar1) && (buff_local = filename + (sVar1 - limit), *buff_local != '.')) &&
     (buff_local[1] != '.')) {
    buff_local = buff_local + 3;
    strcat(buff,"..");
  }
  strcat(buff,buff_local);
  return;
}

Assistant:

void File::buildStrippedFilename(const char* filename, char buff[], std::size_t limit) {
  std::size_t sizeOfFilename = strlen(filename);
  if (sizeOfFilename >= limit) {
    filename += (sizeOfFilename - limit);
    if (filename[0] != '.' && filename[1] != '.') {  // prepend if not already
      filename += 3;  // 3 = '..'
      STRCAT(buff, "..", limit);
    }
  }
  STRCAT(buff, filename, limit);
}